

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_command_queue __thiscall
CLIntercept::getCommandBufferCommandQueue
          (CLIntercept *this,cl_uint numQueues,cl_command_queue *queues,cl_command_buffer_khr cmdbuf
          )

{
  bool bVar1;
  pointer ppVar2;
  CLdispatchX *pCVar3;
  size_type sVar4;
  vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> *pvVar5;
  _cl_command_queue **pp_Var6;
  reference pp_Var7;
  cl_command_buffer_khr in_RCX;
  undefined8 *in_RDX;
  uint in_ESI;
  vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> queues_1;
  CLdispatchX *dispatchX;
  cl_platform_id platform;
  iterator iter;
  cl_command_queue queue;
  lock_guard<std::mutex> lock;
  string *in_stack_000004c8;
  cl_platform_id in_stack_000004d0;
  CLIntercept *in_stack_000004d8;
  map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
  *in_stack_fffffffffffffee8;
  lock_guard<std::mutex> *in_stack_fffffffffffffef0;
  allocator_type *in_stack_ffffffffffffff00;
  CLIntercept *in_stack_ffffffffffffff08;
  _func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *p_Var8;
  vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> local_a8;
  CLdispatchX *local_90;
  allocator local_81;
  string local_80 [32];
  _cl_platform_id *local_60;
  _Self local_58 [3];
  _Self local_40;
  value_type local_38 [2];
  cl_command_buffer_khr local_28;
  uint local_14 [3];
  value_type local_8;
  
  if ((in_ESI == 0) || (in_RDX == (undefined8 *)0x0)) {
    local_28 = in_RCX;
    local_14[0] = in_ESI;
    std::lock_guard<std::mutex>::lock_guard
              (in_stack_fffffffffffffef0,(mutex_type *)in_stack_fffffffffffffee8);
    local_38[0] = (value_type)0x0;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
         ::find(in_stack_fffffffffffffee8,(key_type *)0x20824b);
    local_58[0]._M_node =
         (_Base_ptr)
         std::
         map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
         ::end(in_stack_fffffffffffffee8);
    bVar1 = std::operator!=(&local_40,local_58);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>
                             *)0x2082a3);
      local_60 = ppVar2->second;
      pCVar3 = CLIntercept::dispatchX
                         (in_stack_ffffffffffffff08,(cl_platform_id)in_stack_ffffffffffffff00);
      if (pCVar3->clGetCommandBufferInfoKHR ==
          (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr
           *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"clGetCommandBufferInfoKHR",&local_81);
        getExtensionFunctionAddress(in_stack_000004d8,in_stack_000004d0,in_stack_000004c8);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
      local_90 = CLIntercept::dispatchX
                           (in_stack_ffffffffffffff08,(cl_platform_id)in_stack_ffffffffffffff00);
      if (local_90->clGetCommandBufferInfoKHR !=
          (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr
           *)0x0) {
        (*local_90->clGetCommandBufferInfoKHR)(local_28,0x1295,4,local_14,(size_t *)0x0);
        if (local_14[0] == 1) {
          (*local_90->clGetCommandBufferInfoKHR)(local_28,0x1294,8,local_38,(size_t *)0x0);
        }
        else if (1 < local_14[0]) {
          pvVar5 = (vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> *)
                   (ulong)local_14[0];
          std::allocator<_cl_command_queue_*>::allocator((allocator<_cl_command_queue_*> *)0x208484)
          ;
          std::vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::vector
                    (pvVar5,(size_type)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          std::allocator<_cl_command_queue_*>::~allocator
                    ((allocator<_cl_command_queue_*> *)0x2084a4);
          p_Var8 = local_90->clGetCommandBufferInfoKHR;
          sVar4 = std::vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::size
                            (&local_a8);
          pvVar5 = (vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> *)(sVar4 << 3)
          ;
          pp_Var6 = std::vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::data
                              ((vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> *)
                               0x2084e7);
          (*p_Var8)(local_28,0x1294,(size_t)pvVar5,pp_Var6,(size_t *)0x0);
          pp_Var7 = std::vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::
                    operator[](&local_a8,0);
          local_38[0] = *pp_Var7;
          std::vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::~vector(pvVar5);
        }
      }
    }
    local_8 = local_38[0];
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20858f);
  }
  else {
    local_8 = (value_type)*in_RDX;
  }
  return local_8;
}

Assistant:

cl_command_queue CLIntercept::getCommandBufferCommandQueue(
    cl_uint numQueues,
    const cl_command_queue* queues,
    cl_command_buffer_khr cmdbuf )
{
    if( numQueues != 0 && queues != NULL )
    {
        return queues[0];
    }

    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_command_queue    queue = NULL;

    CCommandBufferInfoMap::iterator iter = m_CommandBufferInfoMap.find( cmdbuf );
    if( iter != m_CommandBufferInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetCommandBufferInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetCommandBufferInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetCommandBufferInfoKHR )
        {
            dispatchX.clGetCommandBufferInfoKHR(
                cmdbuf,
                CL_COMMAND_BUFFER_NUM_QUEUES_KHR,
                sizeof( numQueues ),
                &numQueues,
                NULL );
            if( numQueues == 1)
            {
                dispatchX.clGetCommandBufferInfoKHR(
                    cmdbuf,
                    CL_COMMAND_BUFFER_QUEUES_KHR,
                    sizeof( queue ),
                    &queue,
                    NULL );
            }
            else if( numQueues > 1 )
            {
                std::vector<cl_command_queue> queues(numQueues);
                dispatchX.clGetCommandBufferInfoKHR(
                    cmdbuf,
                    CL_COMMAND_BUFFER_QUEUES_KHR,
                    queues.size() * sizeof(queues[0]),
                    queues.data(),
                    NULL );
                queue = queues[0];
            }
        }
    }

    return queue;
}